

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall
LinearScan::GeneratorBailIn::InsertRestoreSymbols
          (GeneratorBailIn *this,BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUses,
          BVSparse<Memory::JitArenaAllocator> *upwardExposedUses,CapturedValues *capturedValues,
          BailInInsertionPoint *insertionPoint)

{
  ushort uVar1;
  Lifetime *lifetime;
  code *pcVar2;
  undefined4 *puVar3;
  bool bVar4;
  RegSlot regSlot;
  uint32 offset;
  Type *pTVar5;
  StackSym *this_00;
  StackSym *this_01;
  IndirOpnd *src;
  Instr *instr;
  SymOpnd *dst;
  RegOpnd *pRVar6;
  Instr *pIVar7;
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *pSVar8;
  BailInInsertionPoint *pBVar9;
  Iterator local_50;
  BailInInsertionPoint *local_40;
  undefined4 *local_38;
  
  pSVar8 = this->bailInSymbols;
  local_50.list = pSVar8;
  local_50.current = &pSVar8->super_SListNodeBase<Memory::ArenaAllocator>;
  local_40 = insertionPoint;
  local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if (pSVar8 == (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                   *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = local_38;
      *local_38 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
LAB_00539c3e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar3 = 0;
      pSVar8 = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                *)local_50.current;
    }
    local_50.current = (pSVar8->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *)
        local_50.current == local_50.list) {
      return;
    }
    pTVar5 = SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data(&local_50);
    this_00 = SymTable::FindStackSym(this->func->m_symTable,pTVar5->toBackendId);
    lifetime = *(Lifetime **)&(this_00->scratch).globOpt;
    if (lifetime == (Lifetime *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = local_38;
      *local_38 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1461,"(lifetime)","lifetime");
      if (!bVar4) goto LAB_00539c3e;
      *puVar3 = 0;
    }
    this_01 = SymTable::FindStackSym(this->func->m_symTable,pTVar5->fromByteCodeRegSlot);
    regSlot = StackSym::GetByteCodeRegSlot(this_01);
    if ((pTVar5->field_0x8 & 1) == 0) {
      pRVar6 = this->interpreterFrameRegOpnd;
      offset = GetOffsetFromInterpreterStackFrame(this,regSlot);
      src = IR::IndirOpnd::New(pRVar6,offset,this_01->m_type,this->func,false);
    }
    else {
      src = (IndirOpnd *)
            IR::AddrOpnd::New(pTVar5->constValue,AddrOpndKindDynamicVar,this->func,false,(Var)0x0);
    }
    uVar1 = *(ushort *)&lifetime->field_0x9c;
    bVar4 = StackSym::IsConst(this_00);
    pBVar9 = local_40;
    if ((uVar1 & 1) == 0) {
      if (bVar4) {
        instr = InsertLoad(this->linearScan,local_40->instrInsertRegSym,this_00,lifetime->reg);
      }
      else {
        pRVar6 = IR::RegOpnd::New(this_00,this_00->m_type,this->func);
        pBVar9 = local_40;
        pRVar6->m_reg = lifetime->reg;
        instr = InsertMove(&pRVar6->super_Opnd,&src->super_Opnd,local_40->instrInsertRegSym);
      }
      pIVar7 = pBVar9->instrInsertStackSym;
      if (pBVar9->instrInsertRegSym == pBVar9->instrInsertStackSym) {
        pBVar9->instrInsertStackSym = instr;
        pIVar7 = instr;
      }
      if (lifetime->reg == this->interpreterFrameRegOpnd->m_reg) {
        if (pBVar9->instrInsertRegSym == pIVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = local_38;
          *local_38 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x14a0,
                             "(insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym)"
                             ,
                             "insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym"
                            );
          if (!bVar4) goto LAB_00539c3e;
          *puVar3 = 0;
        }
        pBVar9->instrInsertRegSym = instr;
        if (pBVar9->raxRestoreInstr != (Instr *)0x0) {
          IR::Instr::FreeSrc1(pBVar9->raxRestoreInstr);
          IR::Instr::SetSrc1(pBVar9->raxRestoreInstr,&this->interpreterFrameRegOpnd->super_Opnd);
        }
        pBVar9->raxRestoreInstr = instr;
      }
      RecordDef(this->linearScan,lifetime,instr,0);
      pSVar8 = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                *)local_50.current;
    }
    else {
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = local_38;
        *local_38 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x1478,"(!dstSym->IsConst())",
                           "We don\'t need to restore constant symbol that has already been spilled"
                          );
        if (!bVar4) goto LAB_00539c3e;
        *puVar3 = 0;
      }
      this_00->field_0x19 = this_00->field_0x19 | 0x10;
      dst = IR::SymOpnd::New(&this_00->super_Sym,this_00->m_type,this->func);
      pBVar9 = local_40;
      InsertMove(&this->tempRegOpnd->super_Opnd,&src->super_Opnd,local_40->instrInsertStackSym);
      InsertMove(&dst->super_Opnd,&this->tempRegOpnd->super_Opnd,pBVar9->instrInsertStackSym);
      pSVar8 = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                *)local_50.current;
    }
  } while( true );
}

Assistant:

void LinearScan::GeneratorBailIn::InsertRestoreSymbols(
    const BVSparse<JitArenaAllocator>& byteCodeUpwardExposedUses,
    const BVSparse<JitArenaAllocator>& upwardExposedUses,
    const CapturedValues& capturedValues,
    BailInInsertionPoint& insertionPoint
)
{
    FOREACH_SLISTBASE_ENTRY(BailInSymbol, bailInSymbol, this->bailInSymbols)
    {
        StackSym* dstSym = this->func->m_symTable->FindStackSym(bailInSymbol.toBackendId);
        Lifetime* lifetime = dstSym->scratch.linearScan.lifetime;
        Assert(lifetime);

        StackSym* copyPropStackSym = this->func->m_symTable->FindStackSym(bailInSymbol.fromByteCodeRegSlot);
        Js::RegSlot regSlot = copyPropStackSym->GetByteCodeRegSlot();
        IR::Opnd* srcOpnd;
        
        if (bailInSymbol.restoreConstDirectly)
        {
            srcOpnd = IR::AddrOpnd::New(bailInSymbol.constValue, IR::AddrOpndKind::AddrOpndKindDynamicVar, this->func);
        }
        else
        {
            srcOpnd = IR::IndirOpnd::New(
                this->interpreterFrameRegOpnd,
                this->GetOffsetFromInterpreterStackFrame(regSlot),
                copyPropStackSym->GetType(),
                this->func
            );
        }

        if (lifetime->isSpilled)
        {
#if DBG
            AssertMsg(!dstSym->IsConst(), "We don't need to restore constant symbol that has already been spilled");
            // Supress assert in DbPostCheckLower
            dstSym->m_allocated = true;
#endif
            // Stack restores require an extra register since we can't move an indir directly to an indir on amd64
            IR::SymOpnd* dstOpnd = IR::SymOpnd::New(dstSym, dstSym->GetType(), this->func);
            LinearScan::InsertMove(this->tempRegOpnd, srcOpnd, insertionPoint.instrInsertStackSym);
            LinearScan::InsertMove(dstOpnd, this->tempRegOpnd, insertionPoint.instrInsertStackSym);
        }
        else
        {
            // Register restores must come after stack restores so that we have RAX and RCX free to
            // use for stack restores and further RAX must be restored last since it holds the
            // pointer to the InterpreterStackFrame from which we are restoring values.
            // We must also track these restores using RecordDef in case the symbols are spilled.

            IR::Instr* instr;

            if (dstSym->IsConst())
            {
                instr = this->linearScan->InsertLoad(insertionPoint.instrInsertRegSym, dstSym, lifetime->reg);
            }
            else
            {
                IR::RegOpnd* dstRegOpnd = IR::RegOpnd::New(dstSym, dstSym->GetType(), this->func);
                dstRegOpnd->SetReg(lifetime->reg);
                instr = LinearScan::InsertMove(dstRegOpnd, srcOpnd, insertionPoint.instrInsertRegSym);
            }

            if (insertionPoint.instrInsertRegSym == insertionPoint.instrInsertStackSym)
            {
                // This is the first register sym, make sure we don't insert stack stores
                // after this instruction so we can ensure rax and rcx remain free to use
                // for restoring spilled stack syms.
                insertionPoint.instrInsertStackSym = instr;
            }

            if (lifetime->reg == interpreterFrameRegOpnd->GetReg())
            {
                // Ensure rax is restored last
                Assert(insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym);

                insertionPoint.instrInsertRegSym = instr;

                if (insertionPoint.raxRestoreInstr != nullptr)
                {
                    // rax was mapped to multiple bytecode registers. Obviously only the first
                    // restore we do will work so change all following stores to `mov rax, rax`.
                    // We still need to keep them around for RecordDef in case the corresponding
                    // dst sym is spilled later on.
                    insertionPoint.raxRestoreInstr->FreeSrc1();
                    insertionPoint.raxRestoreInstr->SetSrc1(this->interpreterFrameRegOpnd);
                }

                insertionPoint.raxRestoreInstr = instr;
            }

            this->linearScan->RecordDef(lifetime, instr, 0);
        }
    }
    NEXT_SLISTBASE_ENTRY;
}